

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O2

REF_STATUS
ref_clump_zone_around
          (FILE *f,REF_CELL ref_cell,REF_DICT ref_dict,char *zonetype,REF_DICT node_dict,
          REF_NODE ref_node,REF_INT node)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  REF_NODE pRVar7;
  long lVar8;
  long lVar9;
  undefined8 uStackY_1a0;
  REF_INT local;
  FILE *local_188;
  REF_NODE local_180;
  REF_CELL local_178;
  REF_DICT local_170;
  REF_DBL xyz_phys [3];
  REF_DBL xyz_comp [3];
  REF_DBL m [6];
  REF_DBL jacob [9];
  REF_INT nodes [27];
  
  if (ref_dict->n < 1) {
    uVar3 = 0;
  }
  else {
    local_188 = (FILE *)f;
    local_178 = ref_cell;
    uVar3 = ref_node_metric_get(ref_node,node,m);
    if (uVar3 == 0) {
      local_180 = ref_node;
      uVar3 = ref_matrix_jacob_m(m,jacob);
      if (uVar3 == 0) {
        lVar9 = 0;
        local_170 = ref_dict;
        fprintf(local_188,"zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                zonetype,(ulong)(uint)node_dict->n,(ulong)(uint)ref_dict->n,"point",zonetype);
        lVar8 = (long)(node * 0xf);
        pRVar7 = local_180;
        do {
          if (node_dict->n <= lVar9) {
            lVar8 = 0;
            while( true ) {
              if (local_170->n <= lVar8) {
                return 0;
              }
              uVar3 = ref_cell_nodes(local_178,local_170->key[lVar8],nodes);
              if (uVar3 != 0) break;
              for (lVar9 = 0; lVar9 < local_178->node_per; lVar9 = lVar9 + 1) {
                uVar3 = ref_dict_location(node_dict,nodes[lVar9],&local);
                if (uVar3 != 0) {
                  pcVar6 = "ret";
                  uStackY_1a0 = 0x46;
                  goto LAB_001ebbc9;
                }
                fprintf(local_188," %d",(ulong)(local + 1));
              }
              fputc(10,local_188);
              lVar8 = lVar8 + 1;
            }
            pcVar6 = "n";
            uStackY_1a0 = 0x44;
LAB_001ebbc9:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,uStackY_1a0,"ref_clump_zone_around",(ulong)uVar3,pcVar6);
            return uVar3;
          }
          iVar1 = node_dict->key[lVar9];
          lVar5 = (long)iVar1;
          pRVar2 = pRVar7->real;
          xyz_phys[0] = pRVar2[lVar5 * 0xf] - pRVar2[lVar8];
          xyz_phys[1] = pRVar2[lVar5 * 0xf + 1] - pRVar2[lVar8 + 1];
          xyz_phys[2] = pRVar2[lVar5 * 0xf + 2] - pRVar2[lVar8 + 2];
          local = iVar1;
          uVar3 = ref_matrix_vect_mult(jacob,xyz_phys,xyz_comp);
          pRVar7 = local_180;
          if (uVar3 != 0) {
            pcVar6 = "ax";
            uStackY_1a0 = 0x3b;
            goto LAB_001ebb88;
          }
          lVar4 = -1;
          if ((-1 < iVar1) && (iVar1 < local_180->max)) {
            lVar4 = local_180->global[lVar5];
            if (local_180->global[lVar5] < 0) {
              lVar4 = -1;
            }
          }
          pRVar2 = local_180->real;
          fprintf(local_188," %.16e %.16e %.16e %.16e %.16e %.16e %ld\n",pRVar2[lVar5 * 0xf],
                  pRVar2[lVar5 * 0xf + 1],pRVar2[lVar5 * 0xf + 2],xyz_comp[0],xyz_comp[1],
                  xyz_comp[2],lVar4);
          lVar9 = lVar9 + 1;
        } while( true );
      }
      pcVar6 = "jac";
      uStackY_1a0 = 0x2d;
    }
    else {
      pcVar6 = "get";
      uStackY_1a0 = 0x2c;
    }
LAB_001ebb88:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
           uStackY_1a0,"ref_clump_zone_around",(ulong)uVar3,pcVar6);
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_clump_zone_around(
    FILE *f, REF_CELL ref_cell, REF_DICT ref_dict, const char *zonetype,
    REF_DICT node_dict, REF_NODE ref_node, REF_INT node) {
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz_comp[3], xyz_phys[3];
  REF_INT local;
  REF_DBL m[6], jacob[9];

  if (ref_dict_n(ref_dict) <= 0) return REF_SUCCESS;

  RSS(ref_node_metric_get(ref_node, node, m), "get");
  RSS(ref_matrix_jacob_m(m, jacob), "jac");

  fprintf(
      f, "zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      zonetype, ref_dict_n(node_dict), ref_dict_n(ref_dict), "point", zonetype);

  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    xyz_phys[0] =
        ref_node_xyz(ref_node, 0, local) - ref_node_xyz(ref_node, 0, node);
    xyz_phys[1] =
        ref_node_xyz(ref_node, 1, local) - ref_node_xyz(ref_node, 1, node);
    xyz_phys[2] =
        ref_node_xyz(ref_node, 2, local) - ref_node_xyz(ref_node, 2, node);
    RSS(ref_matrix_vect_mult(jacob, xyz_phys, xyz_comp), "ax");
    fprintf(f, " %.16e %.16e %.16e %.16e %.16e %.16e " REF_GLOB_FMT "\n",
            ref_node_xyz(ref_node, 0, local), ref_node_xyz(ref_node, 1, local),
            ref_node_xyz(ref_node, 2, local), xyz_comp[0], xyz_comp[1],
            xyz_comp[2], ref_node_global(ref_node, local));
  }

  for (item = 0; item < ref_dict_n(ref_dict); item++) {
    cell = ref_dict_key(ref_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    fprintf(f, "\n");
  }

  return REF_SUCCESS;
}